

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IMC_Generator.cpp
# Opt level: O2

void __thiscall
nigel::IMC_Generator::addCmd
          (IMC_Generator *this,HexOp operation,shared_ptr<nigel::IM_Operator> *lOp,
          shared_ptr<nigel::IM_Operator> *rOp)

{
  CodeBase *pCVar1;
  undefined1 auStack_58 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  pCVar1 = this->base;
  std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)(auStack_58 + 0x20),
             &lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)(auStack_58 + 0x10),
             &rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>);
  generateCmd((IMC_Generator *)auStack_58,operation,
              (shared_ptr<nigel::IM_Operator> *)(auStack_58 + 0x20),
              (shared_ptr<nigel::IM_Operator> *)(auStack_58 + 0x10));
  std::__cxx11::
  list<std::shared_ptr<nigel::IM_Command>,_std::allocator<std::shared_ptr<nigel::IM_Command>_>_>::
  push_back(&pCVar1->imCommands,(value_type *)auStack_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_58 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_58 + 0x18));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  return;
}

Assistant:

void IMC_Generator::addCmd( HexOp operation, std::shared_ptr<IM_Operator> lOp, std::shared_ptr<IM_Operator> rOp )
	{
		base->imCommands.push_back( generateCmd( operation, lOp, rOp ) );
	}